

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncTraits.h
# Opt level: O3

int luabridge::detail::
    Invoke<char_const*,luabridge::detail::TypeList<char_const*,luabridge::detail::TypeList<bool,void>>,1>
    ::run<char_const*(*)(char_const*,bool)>(lua_State *L,_func_char_ptr_char_ptr_bool **fn)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = Stack<const_char_*>::get(L,1);
  iVar1 = lua_toboolean(L,2);
  pcVar2 = (**fn)(pcVar2,iVar1 != 0);
  if (pcVar2 == (char *)0x0) {
    lua_pushnil(L);
  }
  else {
    lua_pushstring(L,pcVar2);
  }
  return 1;
}

Assistant:

static int run(lua_State* L, Fn& fn)
    {
        try
        {
            ArgList<Params, startParam> args(L);
            Stack<ReturnType>::push(L, FuncTraits<Fn>::call(fn, args));
            return 1;
        }
        catch (const std::exception& e)
        {
            return luaL_error(L, e.what());
        }
    }